

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

void __thiscall
Memory::JitArenaAllocator::Free(JitArenaAllocator *this,void *buffer,size_t byteSize)

{
  if (byteSize == 0x18) {
    *(BVSparseNode **)buffer = this->bvFreeList;
    this->bvFreeList = (BVSparseNode *)buffer;
    return;
  }
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,buffer,
             byteSize);
  return;
}

Assistant:

void Free(void * buffer, size_t byteSize)
    {
        return FreeInline(buffer, byteSize);
    }